

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O0

void test_psbt_write(psbt_test *test,uchar *p,size_t plen)

{
  int iVar1;
  wally_psbt *local_40;
  wally_psbt *psbt;
  size_t written;
  size_t psbt_len;
  size_t i;
  size_t plen_local;
  uchar *p_local;
  psbt_test *test_local;
  
  i = plen;
  plen_local = (size_t)p;
  p_local = (uchar *)test;
  iVar1 = wally_psbt_from_base64(test->base64,&local_40);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = wally_psbt_get_length(local_40,0,&written);
  if (iVar1 != 0) {
    abort();
  }
  for (psbt_len = 0; psbt_len <= written; psbt_len = psbt_len + 1) {
    iVar1 = wally_psbt_to_bytes(local_40,0,(uchar *)((plen_local + i) - psbt_len),psbt_len,
                                (size_t *)&psbt);
    if (iVar1 != 0) {
      fail("wally_psbt_to_bytes %s should have succeeded");
    }
    if (psbt != (wally_psbt *)written) {
      fail("wally_psbt_to_bytes %s wrote %zu in %zu bytes?",*(undefined8 *)(p_local + 8),psbt,
           psbt_len);
    }
  }
  wally_psbt_free(local_40);
  return;
}

Assistant:

static void test_psbt_write(const struct psbt_test *test,
                            unsigned char *p, size_t plen)
{
    size_t i, psbt_len, written;
    struct wally_psbt *psbt;

    if (wally_psbt_from_base64(test->base64, &psbt) != WALLY_OK)
        abort();

    if (wally_psbt_get_length(psbt, 0, &psbt_len) != WALLY_OK)
        abort();

    for (i = 0; i <= psbt_len; i++) {
        /* A too short buffer should return OK and the required length */
        if (wally_psbt_to_bytes(psbt, 0, p + plen - i, i, &written) != WALLY_OK) {
            fail("wally_psbt_to_bytes %s should have succeeded", test->base64);
        }
        if (written != psbt_len)
            fail("wally_psbt_to_bytes %s wrote %zu in %zu bytes?",
                 test->base64, written, i);
    }
    wally_psbt_free(psbt);
}